

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QDockWidgetGroupWindow::apply(QDockWidgetGroupWindow *this)

{
  QLayout *pQVar1;
  
  pQVar1 = QWidget::layout((QWidget *)this);
  QDockAreaLayoutInfo::clear((QDockAreaLayoutInfo *)(pQVar1 + 8));
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0xffffffffffffffff;
  pQVar1 = QWidget::layout((QWidget *)this);
  QDockAreaLayoutInfo::plug
            ((QDockAreaLayoutInfo *)&pQVar1[4].super_QLayoutItem,(QList<int> *)(this + 0x38));
  QList<int>::clear((QList<int> *)(this + 0x38));
  adjustFlags(this);
  pQVar1 = QWidget::layout((QWidget *)this);
  QDockAreaLayoutInfo::apply((QDockAreaLayoutInfo *)&pQVar1[4].super_QLayoutItem,false);
  return;
}

Assistant:

void QDockWidgetGroupWindow::apply()
{
    static_cast<QDockWidgetGroupLayout *>(layout())->savedState.clear();
    currentGapRect = QRect();
    layoutInfo()->plug(currentGapPos);
    currentGapPos.clear();
    adjustFlags();
    layoutInfo()->apply(false);
}